

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::tableOther(GrpParser *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp63_AST;
  RefAST tmp62_AST;
  RefAST tmp61_AST;
  RefAST tmp60_AST;
  RefAST tableOther_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  ASTPair *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  RefToken *in_stack_fffffffffffffea0;
  RefToken *tok;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  ASTFactory *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  GrpParser *in_stack_ffffffffffffff30;
  undefined1 local_b8 [8];
  undefined1 local_b0 [16];
  GrpParser *in_stack_ffffffffffffff60;
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  undefined1 local_60 [24];
  undefined1 local_48 [72];
  
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  ASTPair::ASTPair(in_stack_fffffffffffffe80);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffe80->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffe80->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
  ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     in_stack_fffffffffffffea0);
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe80);
  Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                in_stack_fffffffffffffeac);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffe80->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  (**(code **)(*in_RDI + 0x28))(local_60,in_RDI,1);
  ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     in_stack_fffffffffffffea0);
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe80);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffe80->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  ASTFactory::addASTChild
            (in_stack_fffffffffffffec0,
             (ASTPair *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (RefAST *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
  Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                in_stack_fffffffffffffeac);
  RefCount<AST>::RefCount
            (&in_stack_fffffffffffffe80->root,
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  (**(code **)(*in_RDI + 0x28))(local_80,in_RDI,1);
  ASTFactory::create((ASTFactory *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     in_stack_fffffffffffffea0);
  RefCount<AST>::operator=
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe80);
  Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                in_stack_fffffffffffffeac);
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if ((iVar2 == 0xb) &&
     ((((iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 == 0xc ||
        (in_stack_fffffffffffffef4 = (**(code **)(*in_RDI + 0x20))(in_RDI,2),
        in_stack_fffffffffffffef4 == 0xd)) &&
       (in_stack_fffffffffffffef0 = (**(code **)(*in_RDI + 0x20))(in_RDI,3),
       3 < in_stack_fffffffffffffef0)) &&
      (in_stack_fffffffffffffeec = (**(code **)(*in_RDI + 0x20))(in_RDI,3),
      in_stack_fffffffffffffeec < 0x72)))) {
    directives(in_stack_ffffffffffffff30);
    RefCount<AST>::RefCount
              (&in_stack_fffffffffffffe80->root,
               (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    ASTFactory::addASTChild
              (in_stack_fffffffffffffec0,
               (ASTPair *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (RefAST *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
  }
  else {
    iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    if ((iVar2 < 4) || (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), 0x71 < iVar2)) {
LAB_001faa67:
      uVar5 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_90,in_RDI,1);
      NoViableAltException::NoViableAltException
                ((NoViableAltException *)
                 CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 (RefToken *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      __cxa_throw(uVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    if (!bVar1) goto LAB_001faa67;
    (**(code **)(*in_RDI + 0x20))(in_RDI,3);
    bVar1 = BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    if (!bVar1) goto LAB_001faa67;
  }
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (((iVar2 == 8) &&
      (in_stack_fffffffffffffeb8 = (**(code **)(*in_RDI + 0x20))(in_RDI,2),
      3 < in_stack_fffffffffffffeb8)) &&
     (in_stack_fffffffffffffeb4 = (**(code **)(*in_RDI + 0x20))(in_RDI,2),
     in_stack_fffffffffffffeb4 < 0x72)) {
    in_stack_fffffffffffffeb0 = (**(code **)(*in_RDI + 0x20))(in_RDI,3);
    bVar1 = BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    iVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac);
    if (bVar1) {
      RefCount<AST>::RefCount
                (&in_stack_fffffffffffffe80->root,
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      tok = (RefToken *)(in_RDI + 6);
      (**(code **)(*in_RDI + 0x28))(local_b0,in_RDI,1);
      ASTFactory::create((ASTFactory *)CONCAT44(iVar3,in_stack_fffffffffffffea8),tok);
      RefCount<AST>::operator=
                ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe80);
      Parser::match((Parser *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),iVar3);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
      goto LAB_001fae97;
    }
  }
  iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if ((3 < iVar3) && (iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), iVar3 < 0x72)) {
    in_stack_fffffffffffffe94 = (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                           (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
    in_stack_fffffffffffffe90 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe90);
    if (bVar1) {
      in_stack_fffffffffffffe8c = (**(code **)(*in_RDI + 0x20))(in_RDI,3);
      bVar1 = BitSet::member((BitSet *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
                             ,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
      in_stack_fffffffffffffe88 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe88);
      if (bVar1) {
LAB_001fae97:
        while( true ) {
          uVar4 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
          bVar1 = BitSet::member((BitSet *)CONCAT44(uVar4,in_stack_fffffffffffffe78),
                                 (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
          in_stack_fffffffffffffe78 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe78);
          if (!bVar1) break;
          otherEntry(in_stack_ffffffffffffff60);
          in_stack_fffffffffffffe70 = (ASTPair *)(in_RDI + 6);
          RefCount<AST>::RefCount
                    (&in_stack_fffffffffffffe80->root,
                     (RefCount<AST> *)CONCAT44(uVar4,in_stack_fffffffffffffe78));
          ASTFactory::addASTChild
                    (in_stack_fffffffffffffec0,(ASTPair *)CONCAT44(iVar2,in_stack_fffffffffffffeb8),
                     (RefAST *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
          RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
        }
        RefCount<AST>::operator=
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
        RefCount<AST>::operator=
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (RefCount<AST> *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        RefCount<AST>::~RefCount(&in_stack_fffffffffffffe70->root);
        ASTPair::~ASTPair(in_stack_fffffffffffffe70);
        return;
      }
    }
  }
  uVar5 = __cxa_allocate_exception(0x40);
  (**(code **)(*in_RDI + 0x28))(local_b8,in_RDI,1);
  NoViableAltException::NoViableAltException
            ((NoViableAltException *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             (RefToken *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  __cxa_throw(uVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::tableOther() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST tableOther_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp60_AST = nullAST;
		tmp60_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp61_AST = nullAST;
		tmp61_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp61_AST);
		match(IDENT);
		RefAST tmp62_AST = nullAST;
		tmp62_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		if ((LA(1)==OP_LBRACE) && (LA(2)==OP_RBRACE||LA(2)==IDENT) && ((LA(3) >= OP_EQ && LA(3) <= AT_IDENT))) {
			directives();
			astFactory.addASTChild(currentAST, returnAST);
		}
		else if (((LA(1) >= OP_EQ && LA(1) <= AT_IDENT)) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		if ((LA(1)==OP_SEMI) && ((LA(2) >= OP_EQ && LA(2) <= AT_IDENT)) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp63_AST = nullAST;
			tmp63_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if (((LA(1) >= OP_EQ && LA(1) <= AT_IDENT)) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		{
		do {
			if ((_tokenSet_13.member(LA(1)))) {
				otherEntry();
				astFactory.addASTChild(currentAST, returnAST);
			}
			else {
				goto _loop341;
			}
			
		} while (true);
		_loop341:;
		}
		tableOther_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_11);
	}
	returnAST = tableOther_AST;
}